

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

RuntimeID __thiscall Jinx::Impl::Parser::VariableNameToRuntimeID(Parser *this,String *name)

{
  char *name_00;
  size_t nameLen;
  size_t stackDepth;
  mapped_type *this_00;
  RuntimeID id;
  RuntimeID local_28;
  
  name_00 = (name->_M_dataplus)._M_p;
  nameLen = name->_M_string_length;
  stackDepth = VariableStackFrame::GetStackDepthFromName(&this->m_variableStackFrame,name);
  local_28 = GetVariableId(name_00,nameLen,stackDepth);
  this_00 = std::
            map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
            ::operator[](&this->m_idNameMap,&local_28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_assign
            (this_00,name);
  return local_28;
}

Assistant:

inline_t RuntimeID Parser::VariableNameToRuntimeID(const String & name)
	{
		auto id = GetVariableId(name.c_str(), name.size(), m_variableStackFrame.GetStackDepthFromName(name));
		m_idNameMap[id] = name;
		return id;
	}